

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinLocalSinkState::HashJoinLocalSinkState
          (HashJoinLocalSinkState *this,PhysicalHashJoin *op,ClientContext *context,
          HashJoinGlobalSinkState *gstate)

{
  pointer pJVar1;
  _Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false> this_00;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar2;
  undefined8 uVar3;
  HashJoinGlobalSinkState *pHVar4;
  Allocator *allocator;
  type expr;
  pointer pJVar5;
  type this_01;
  pointer *__ptr;
  PartitionedTupleDataAppendState *gstate_00;
  JoinCondition *cond;
  pointer pJVar6;
  undefined1 local_68 [16];
  DataChunk *local_58;
  PartitionedTupleDataAppendState *local_50;
  DataChunk *local_48;
  HashJoinGlobalSinkState *local_40;
  ClientContext *local_38;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar2 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__HashJoinLocalSinkState_02463d38;
  local_50 = &this->append_state;
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState(local_50);
  ExpressionExecutor::ExpressionExecutor(&this->join_key_executor,context);
  local_48 = &this->join_keys;
  DataChunk::DataChunk(local_48);
  local_58 = &this->payload_chunk;
  DataChunk::DataChunk(local_58);
  local_68._8_8_ = &this->hash_table;
  this->hash_table =
       (unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)0x0;
  this->local_filter_state =
       (unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
       )0x0;
  local_40 = gstate;
  local_38 = context;
  allocator = BufferAllocator::Get(context);
  pJVar1 = (op->super_PhysicalComparisonJoin).conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pJVar6 = (op->super_PhysicalComparisonJoin).conditions.
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start; pJVar6 != pJVar1; pJVar6 = pJVar6 + 1) {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&pJVar6->right);
    ExpressionExecutor::AddExpression(&this->join_key_executor,expr);
  }
  DataChunk::Initialize(local_48,allocator,&op->condition_types,0x800);
  if ((op->payload_columns).col_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->payload_columns).col_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize(local_58,allocator,&(op->payload_columns).col_types,0x800);
  }
  PhysicalHashJoin::InitializeHashTable((PhysicalHashJoin *)local_68,(ClientContext *)op);
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (JoinHashTable *)0x0;
  ::std::__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::reset
            ((__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *)
             local_68._8_8_,(pointer)uVar3);
  uVar3 = local_68._0_8_;
  if ((JoinHashTable *)local_68._0_8_ != (JoinHashTable *)0x0) {
    JoinHashTable::~JoinHashTable((JoinHashTable *)local_68._0_8_);
    operator_delete((void *)uVar3);
  }
  pJVar5 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                       *)local_68._8_8_);
  this_01 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator*(&pJVar5->sink_collection);
  gstate_00 = local_50;
  PartitionedTupleData::InitializeAppendState(this_01,local_50,UNPIN_AFTER_DONE);
  pHVar4 = local_40;
  LOCK();
  (local_40->active_local_states).super___atomic_base<unsigned_long>._M_i =
       (local_40->active_local_states).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if ((op->super_PhysicalComparisonJoin).filter_pushdown.
      super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl !=
      (JoinFilterPushdownInfo *)0x0) {
    unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
    ::operator->(&(op->super_PhysicalComparisonJoin).filter_pushdown);
    unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
    ::operator*(&pHVar4->global_filter_state);
    JoinFilterPushdownInfo::GetLocalState
              ((JoinFilterPushdownInfo *)local_68,(JoinFilterGlobalState *)gstate_00);
    uVar3 = local_68._0_8_;
    local_68._0_8_ = (JoinFilterLocalState *)0x0;
    this_00._M_head_impl =
         (this->local_filter_state).
         super_unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::JoinFilterLocalState_*,_std::default_delete<duckdb::JoinFilterLocalState>_>
         .super__Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false>._M_head_impl;
    (this->local_filter_state).
    super_unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::JoinFilterLocalState_*,_std::default_delete<duckdb::JoinFilterLocalState>_>
    .super__Head_base<0UL,_duckdb::JoinFilterLocalState_*,_false>._M_head_impl =
         (JoinFilterLocalState *)uVar3;
    if (this_00._M_head_impl != (JoinFilterLocalState *)0x0) {
      JoinFilterLocalState::~JoinFilterLocalState(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
      uVar3 = local_68._0_8_;
      if ((JoinFilterLocalState *)local_68._0_8_ != (JoinFilterLocalState *)0x0) {
        JoinFilterLocalState::~JoinFilterLocalState((JoinFilterLocalState *)local_68._0_8_);
        operator_delete((void *)uVar3);
      }
    }
  }
  return;
}

Assistant:

HashJoinLocalSinkState(const PhysicalHashJoin &op, ClientContext &context, HashJoinGlobalSinkState &gstate)
	    : join_key_executor(context) {
		auto &allocator = BufferAllocator::Get(context);

		for (auto &cond : op.conditions) {
			join_key_executor.AddExpression(*cond.right);
		}
		join_keys.Initialize(allocator, op.condition_types);

		if (!op.payload_columns.col_types.empty()) {
			payload_chunk.Initialize(allocator, op.payload_columns.col_types);
		}

		hash_table = op.InitializeHashTable(context);
		hash_table->GetSinkCollection().InitializeAppendState(append_state);

		gstate.active_local_states++;

		if (op.filter_pushdown) {
			local_filter_state = op.filter_pushdown->GetLocalState(*gstate.global_filter_state);
		}
	}